

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O1

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::Exprs2EExprs<std::initializer_list<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,2ul>
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,initializer_list<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *ea,
          array<mp::EExpr,_2UL> *result)

{
  EExpr *this_00;
  long lVar1;
  iterator pBVar2;
  EExpr local_1f0;
  
  pBVar2 = ea->_M_array;
  lVar1 = 0;
  do {
    BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ::Visit(&local_1f0,
            (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
             *)this,(Expr)(pBVar2->super_ExprBase).impl_);
    this_00 = (EExpr *)((long)&result->_M_elems[0].super_QuadraticExpr.super_QuadAndLinTerms.
                               super_LinTerms.coefs_.
                               super_small_vector_base<std::allocator<double>,_6U>.m_data + lVar1);
    if (this_00 != &local_1f0) {
      gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                ((small_vector_base<std::allocator<double>,_6U> *)this_00,
                 (small_vector_base<std::allocator<double>,_6U> *)&local_1f0);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                ((small_vector_base<std::allocator<int>,_6U> *)
                 ((long)&result->_M_elems[0].super_QuadraticExpr.super_QuadAndLinTerms.
                         super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                         m_data + lVar1),
                 &local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                  super_small_vector_base<std::allocator<int>,_6U>);
      gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
      move_assign_default<8U,_nullptr>
                ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
                 ((long)&result->_M_elems[0].super_QuadraticExpr.super_QuadAndLinTerms.
                         super_QuadTerms.folded_.
                         super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                         .m_data + lVar1),
                 (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
                 &local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms);
      gch::detail::small_vector_base<std::allocator<double>,_6U>::move_assign_default<6U,_nullptr>
                ((small_vector_base<std::allocator<double>,_6U> *)
                 ((long)&result->_M_elems[0].super_QuadraticExpr.super_QuadAndLinTerms.
                         super_QuadTerms.coefs_aux_.
                         super_small_vector_base<std::allocator<double>,_6U>.m_data + lVar1),
                 &local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
                  super_small_vector_base<std::allocator<double>,_6U>);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                ((small_vector_base<std::allocator<int>,_6U> *)
                 ((long)&result->_M_elems[0].super_QuadraticExpr.super_QuadAndLinTerms.
                         super_QuadTerms.vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>
                         .m_data + lVar1),
                 &local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>);
      gch::detail::small_vector_base<std::allocator<int>,_6U>::move_assign_default<6U,_nullptr>
                ((small_vector_base<std::allocator<int>,_6U> *)
                 ((long)&result->_M_elems[0].super_QuadraticExpr.super_QuadAndLinTerms.
                         super_QuadTerms.vars2_aux_.super_small_vector_base<std::allocator<int>,_6U>
                         .m_data + lVar1),
                 &local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
                  super_small_vector_base<std::allocator<int>,_6U>);
    }
    *(double *)((long)&result->_M_elems[0].super_QuadraticExpr.constant_term_ + lVar1) =
         local_1f0.super_QuadraticExpr.constant_term_;
    if (6 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars2_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.vars1_aux_
                      .super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_
                      .super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.coefs_aux_
                      .super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if (8 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_capacity) {
      operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_data_ptr,
                      local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_QuadTerms.folded_.
                      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      .m_data.
                      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                      .m_capacity << 4);
    }
    if (6 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
            super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
            super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_1f0.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    pBVar2 = pBVar2 + 1;
    lVar1 = lVar1 + 0x1c0;
  } while (lVar1 == 0x1c0);
  return;
}

Assistant:

void Exprs2EExprs(const ExprArray& ea, std::array<EExpr, N>& result) {
    assert(ea.size() == result.size());
    auto itea = ea.begin();
    for (size_t i=0; i<N; ++i, ++itea)
      result[i] = MP_DISPATCH( Convert2EExpr(*itea) );
  }